

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_bf_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *in_RDX;
  uint *in_RSI;
  CTState *in_RDI;
  CTypeID did;
  uint8_t tmpbool;
  uint32_t mask;
  uint32_t val;
  CTSize bsz;
  CTSize pos;
  CTInfo info;
  ErrMsg in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  byte local_75;
  uint local_70;
  byte local_6c;
  byte local_68;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  CTState *in_stack_ffffffffffffffe8;
  
  uVar3 = *in_RSI;
  if ((uVar3 & 0x8000000) == 0) {
    in_stack_ffffffffffffff84 = 9;
    if ((uVar3 & 0x800000) != 0) {
      in_stack_ffffffffffffff84 = 10;
    }
    lj_cconv_ct_tv(in_stack_ffffffffffffffe8,
                   (CType *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8,
                   (TValue *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (CTInfo)((ulong)in_RDI >> 0x20));
  }
  else {
    lj_cconv_ct_tv(in_RDI,(CType *)CONCAT44(3,in_stack_ffffffffffffffe0),(uint8_t *)in_RDI,
                   (TValue *)CONCAT44(3,in_stack_ffffffffffffffd0),
                   (CTInfo)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    local_70 = (uint)local_75;
  }
  uVar1 = uVar3 >> 8 & 0x7f;
  if ((uVar3 & 0x7f) + uVar1 <= (uVar3 >> 0x10 & 0x7f) << 3) {
    local_6c = (byte)uVar1;
    local_68 = (byte)(uVar3 & 0x7f);
    uVar1 = (1 << (local_6c & 0x1f)) + -1 << (local_68 & 0x1f);
    uVar2 = local_70 << (local_68 & 0x1f) & uVar1;
    uVar3 = uVar3 >> 0x10 & 0x7f;
    if (uVar3 == 1) {
      *(byte *)in_RDX = (byte)*in_RDX & ((byte)uVar1 ^ 0xff) | (byte)uVar2;
    }
    else if (uVar3 == 2) {
      *(ushort *)in_RDX = (ushort)*in_RDX & ((ushort)uVar1 ^ 0xffff) | (ushort)uVar2;
    }
    else if (uVar3 == 4) {
      *in_RDX = *in_RDX & (uVar1 ^ 0xffffffff) | uVar2;
    }
    return;
  }
  lj_err_caller((lua_State *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c);
}

Assistant:

void lj_cconv_bf_tv(CTState *cts, CType *d, uint8_t *dp, TValue *o)
{
  CTInfo info = d->info;
  CTSize pos, bsz;
  uint32_t val, mask;
  lua_assert(ctype_isbitfield(info));
  if ((info & CTF_BOOL)) {
    uint8_t tmpbool;
    lua_assert(ctype_bitbsz(info) == 1);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_BOOL), &tmpbool, o, 0);
    val = tmpbool;
  } else {
    CTypeID did = (info & CTF_UNSIGNED) ? CTID_UINT32 : CTID_INT32;
    lj_cconv_ct_tv(cts, ctype_get(cts, did), (uint8_t *)&val, o, 0);
  }
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lua_assert(pos < 8*ctype_bitcsz(info));
  lua_assert(bsz > 0 && bsz <= 8*ctype_bitcsz(info));
  /* Check if a packed bitfield crosses a container boundary. */
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  mask = ((1u << bsz) - 1u) << pos;
  val = (val << pos) & mask;
  /* NYI: packed bitfields may cause misaligned reads/writes. */
  switch (ctype_bitcsz(info)) {
  case 4: *(uint32_t *)dp = (*(uint32_t *)dp & ~mask) | (uint32_t)val; break;
  case 2: *(uint16_t *)dp = (*(uint16_t *)dp & ~mask) | (uint16_t)val; break;
  case 1: *(uint8_t *)dp = (*(uint8_t *)dp & ~mask) | (uint8_t)val; break;
  default: lua_assert(0); break;
  }
}